

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O0

uint32_t __thiscall Cache::log2i(Cache *this,uint32_t val)

{
  uint32_t ret;
  uint32_t val_local;
  Cache *this_local;
  undefined4 local_4;
  
  if (val == 0) {
    local_4 = 0xffffffff;
  }
  else if (val == 1) {
    local_4 = 0;
  }
  else {
    ret = 0;
    for (val_local = val; 1 < val_local; val_local = val_local >> 1) {
      ret = ret + 1;
    }
    local_4 = ret;
  }
  return local_4;
}

Assistant:

uint32_t Cache::log2i(uint32_t val) {
  if (val == 0)
    return uint32_t(-1);
  if (val == 1)
    return 0;
  uint32_t ret = 0;
  while (val > 1) {
    val >>= 1;
    ret++;
  }
  return ret;
}